

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_limit.cpp
# Opt level: O2

void __thiscall duckdb::LimitLocalState::~LimitLocalState(LimitLocalState *this)

{
  ~LimitLocalState(this);
  operator_delete(this);
  return;
}

Assistant:

explicit LimitLocalState(ClientContext &context, const PhysicalLimit &op)
	    : current_offset(0), data(context, op.types, true) {
		PhysicalLimit::SetInitialLimits(op.limit_val, op.offset_val, limit, offset);
	}